

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::CommandRunner::ReadTextModule
          (CommandRunner *this,string_view module_filename,string *header,bool validate)

{
  Result RVar1;
  string_view filename;
  Errors *in_stack_ffffffffffffff40;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  Errors errors;
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  char *local_48 [3];
  
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filename._M_str = (char *)&file_data;
  filename._M_len = (size_t)module_filename._M_str;
  RVar1 = wabt::ReadFile((wabt *)module_filename._M_len,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)header);
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  wabt::WastLexer::CreateBufferLexer
            ((string_view)ZEXT816(0),
             (void *)lexer._M_t.
                     super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                     .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,
             (size_t)module._M_t.
                     super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
                     super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                     super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,
             in_stack_ffffffffffffff40);
  if (RVar1.enum_ == Ok) {
    module._M_t.super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
    super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::Module,_std::default_delete<wabt::Module>,_true,_true>)
         (__uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>)0x0;
    line_finder._M_t.
    super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
    ._M_t.
    super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
    .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
          )(__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
            )s_features._0_8_;
    RVar1 = wabt::ParseWatModule
                      ((WastLexer *)
                       lexer._M_t.
                       super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                       .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,&module,&errors
                       ,(WastParseOptions *)&line_finder);
    if (RVar1.enum_ == Ok && validate) {
      local_48[0] = (char *)s_features._0_8_;
      local_48[1]._0_1_ = s_features.tail_call_enabled_;
      local_48[1]._1_1_ = s_features.bulk_memory_enabled_;
      local_48[1]._2_1_ = s_features.reference_types_enabled_;
      local_48[1]._3_1_ = s_features.annotations_enabled_;
      local_48[1]._4_1_ = s_features.code_metadata_enabled_;
      local_48[1]._5_1_ = s_features.gc_enabled_;
      local_48[1]._6_1_ = s_features.memory64_enabled_;
      local_48._15_4_ = s_features._15_4_;
      RVar1 = wabt::ValidateModule
                        ((Module *)
                         module._M_t.
                         super___uniq_ptr_impl<wabt::Module,_std::default_delete<wabt::Module>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_wabt::Module_*,_std::default_delete<wabt::Module>_>.
                         super__Head_base<0UL,_wabt::Module_*,_false>._M_head_impl,&errors,
                         (ValidateOptions *)local_48);
    }
    std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr(&module);
  }
  wabt::WastLexer::MakeLineFinder((WastLexer *)&line_finder);
  wabt::FormatErrorsToFile
            (&errors,Text,
             (LexerSourceLineFinder *)
             line_finder._M_t.
             super___uniq_ptr_impl<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
             ._M_t.
             super__Tuple_impl<0UL,_wabt::LexerSourceLineFinder_*,_std::default_delete<wabt::LexerSourceLineFinder>_>
             .super__Head_base<0UL,_wabt::LexerSourceLineFinder_*,_false>._M_head_impl,_stdout,
             header,Once,0x50);
  std::unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
  ~unique_ptr(&line_finder);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&lexer);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return (Result)RVar1.enum_;
}

Assistant:

wabt::Result CommandRunner::ReadTextModule(std::string_view module_filename,
                                           const std::string& header,
                                           bool validate) {
  std::vector<uint8_t> file_data;
  wabt::Result result = ReadFile(module_filename, &file_data);
  Errors errors;
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      module_filename, file_data.data(), file_data.size(), &errors);
  if (Succeeded(result)) {
    std::unique_ptr<wabt::Module> module;
    WastParseOptions options(s_features);
    result = ParseWatModule(lexer.get(), &module, &errors, &options);

    if (validate && Succeeded(result)) {
      result =
          ValidateModule(module.get(), &errors, ValidateOptions{s_features});
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get(), stdout,
                     header, PrintHeader::Once);
  return result;
}